

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void INT_EVsend_stored(CManager_conflict cm,EVstone stone_num,EVaction action_num)

{
  int *piVar1;
  _proto_action *p_Var2;
  int iVar3;
  stone_type p_Var4;
  event_item *event;
  CManager_conflict evp;
  
  p_Var4 = stone_struct(cm->evp,stone_num);
  if (p_Var4 != (stone_type)0x0) {
    p_Var2 = p_Var4->proto_actions;
    while (event = (event_item *)
                   (**(code **)(p_Var2[action_num].o.bri.remote_contact + 0x18))
                             (cm,(undefined1 *)((long)&p_Var2[action_num].o + 0x18)),
          event != (event_item *)0x0) {
      evp = cm;
      internal_path_submit(cm,p_Var2[action_num].o.thr_bri.target_stone_id,event);
      piVar1 = &p_Var2[action_num].o.term.target_stone_id;
      *piVar1 = *piVar1 + -1;
      return_event((event_path_data)evp,event);
      do {
        iVar3 = process_local_actions(cm);
      } while (iVar3 != 0);
    }
  }
  return;
}

Assistant:

void
INT_EVsend_stored(CManager cm, EVstone stone_num, EVaction action_num)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    event_item *item;
    proto_action *p;

    stone = stone_struct(evp, stone_num);
    if (!stone) return;

    p = &stone->proto_actions[action_num];
    while ((item = storage_queue_dequeue(cm, &p->o.store.queue)) != NULL) {
        internal_path_submit(cm, p->o.store.target_stone_id, item);
        p->o.store.num_stored--;
        return_event(evp, item);
        while (process_local_actions(cm));
    }
}